

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O1

void * cargo_get_group_context(cargo_t ctx,char *group)

{
  void *pvVar1;
  
  if (group == (char *)0x0) {
    group = "";
  }
  pvVar1 = _cargo_get_group_context(ctx,group,ctx->groups,ctx->group_count);
  return pvVar1;
}

Assistant:

static void * _cargo_get_group_context(cargo_t ctx, const char *group,
                cargo_group_t *groups, size_t group_count)
{
    cargo_group_t *grp = NULL;
    assert(ctx);

    grp = _cargo_find_group(ctx, groups, group_count, group, NULL);

    if (!grp)
    {
        CARGODBG(1, "No such group \"%s\"\n", group);
        return NULL;
    }

    return grp->user;
}